

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::Cpgoto::emit(Cpgoto *this,OutputFile *o,uint32_t ind,bool *readCh)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  SwitchIf *in_R9;
  undefined1 local_48 [8];
  string yych;
  bool *readCh_local;
  uint32_t ind_local;
  OutputFile *o_local;
  Cpgoto *this_local;
  
  yych.field_2._8_8_ = readCh;
  output_hgo_abi_cxx11_
            ((string *)local_48,(re2c *)o,(OutputFile *)(ulong)ind,(uint32_t)readCh,
             (bool *)this->hgo,in_R9);
  OutputFile::ws(o,"{\n");
  CpgotoTable::emit(this->table,o,ind + 1);
  pOVar1 = OutputFile::wind(o,ind + 1);
  pOVar1 = OutputFile::ws(pOVar1,"goto *");
  poVar2 = Opt::operator->((Opt *)&opts);
  pOVar1 = OutputFile::wstring(pOVar1,&poVar2->yytarget);
  pOVar1 = OutputFile::ws(pOVar1,"[");
  pOVar1 = OutputFile::wstring(pOVar1,(string *)local_48);
  OutputFile::ws(pOVar1,"];\n");
  pOVar1 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar1,"}\n");
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Cpgoto::emit (OutputFile & o, uint32_t ind, bool & readCh)
{
	std::string yych = output_hgo (o, ind, readCh, hgo);
	o.ws("{\n");
	table->emit (o, ++ind);
	o.wind(ind).ws("goto *").wstring(opts->yytarget).ws("[").wstring(yych).ws("];\n");
	o.wind(--ind).ws("}\n");
}